

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

bool __thiscall
msgpack11::
Value<(msgpack11::MsgPack::Type)15,_std::map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>_>
::less(Value<(msgpack11::MsgPack::Type)15,_std::map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>_>
       *this,MsgPackValue *other)

{
  int iVar1;
  int iVar2;
  bool local_29;
  bool local_1b;
  bool is_less_type;
  bool is_same_type;
  MsgPackValue *other_local;
  Value<(msgpack11::MsgPack::Type)15,_std::map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>_>
  *this_local;
  
  iVar1 = (*other->_vptr_MsgPackValue[3])();
  iVar2 = (*other->_vptr_MsgPackValue[3])();
  local_1b = true;
  if (iVar2 < 0x10) {
    local_29 = false;
    if (iVar1 == 0xf) {
      local_29 = std::operator<(&this->m_value,
                                (map<msgpack11::MsgPack,_msgpack11::MsgPack,_std::less<msgpack11::MsgPack>,_std::allocator<std::pair<const_msgpack11::MsgPack,_msgpack11::MsgPack>_>_>
                                 *)(other + 1));
    }
    local_1b = local_29;
  }
  return local_1b;
}

Assistant:

bool less(const MsgPackValue * other) const override {
        bool const is_same_type = tag == other->type();
        bool const is_less_type = tag < other->type();
        return is_less_type || (is_same_type && (m_value < static_cast<const Value<tag, T> *>(other)->m_value));
    }